

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uint8_t pull_u8(uchar **cursor,size_t *max)

{
  uint8_t local_19;
  size_t *psStack_18;
  uint8_t v;
  size_t *max_local;
  uchar **cursor_local;
  
  psStack_18 = max;
  max_local = (size_t *)cursor;
  pull_bytes(&local_19,1,cursor,max);
  return local_19;
}

Assistant:

uint8_t pull_u8(const unsigned char **cursor, size_t *max)
{
    uint8_t v;
    pull_bytes(&v, sizeof(v), cursor, max);
    return v;
}